

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err chunk_ingest_len(nni_http_chunks *cl,char c)

{
  ushort **ppuVar1;
  char c_local;
  nni_http_chunks *cl_local;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[(int)c] & 0x800) == 0) {
    if ((c < 'A') || ('F' < c)) {
      if ((c < 'a') || ('f' < c)) {
        if (c == ';') {
          cl->cl_state = CS_EXT;
        }
        else {
          if (c != '\r') {
            return NNG_EPROTO;
          }
          cl->cl_state = CS_CR;
        }
      }
      else {
        cl->cl_size = cl->cl_size << 4;
        cl->cl_size = (long)(c + -0x57) + cl->cl_size;
      }
    }
    else {
      cl->cl_size = cl->cl_size << 4;
      cl->cl_size = (long)(c + -0x37) + cl->cl_size;
    }
  }
  else {
    cl->cl_size = cl->cl_size << 4;
    cl->cl_size = (long)(c + -0x30) + cl->cl_size;
  }
  return NNG_OK;
}

Assistant:

static nng_err
chunk_ingest_len(nni_http_chunks *cl, char c)
{
	if (isdigit(c)) {
		cl->cl_size *= 16;
		cl->cl_size += (c - '0');
	} else if ((c >= 'A') && (c <= 'F')) {
		cl->cl_size *= 16;
		cl->cl_size += (c - 'A') + 10;
	} else if ((c >= 'a') && (c <= 'f')) {
		cl->cl_size *= 16;
		cl->cl_size += (c - 'a') + 10;
	} else if (c == ';') {
		cl->cl_state = CS_EXT;
	} else if (c == '\r') {
		cl->cl_state = CS_CR;
	} else {
		return (NNG_EPROTO);
	}
	return (NNG_OK);
}